

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> *
google::protobuf::internal::MapKeySorter::SortKey
          (vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
           *__return_storage_ptr__,Message *message,Reflection *reflection,FieldDescriptor *field)

{
  pointer pMVar1;
  pointer pMVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  MapIterator it;
  MapIterator local_90;
  MapIterator local_60;
  
  (__return_storage_ptr__->
  super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Reflection::MapBegin(&local_90,reflection,message,field);
  while( true ) {
    Reflection::MapEnd(&local_60,reflection,message,field);
    iVar4 = (*(local_90.map_)->_vptr_MapFieldBase[5])(local_90.map_,&local_90,&local_60);
    MapIterator::~MapIterator(&local_60);
    if ((char)iVar4 != '\0') break;
    std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>::push_back
              (__return_storage_ptr__,&local_90.key_);
    (*(local_90.map_)->_vptr_MapFieldBase[0x12])(local_90.map_,&local_90);
  }
  MapIterator::~MapIterator(&local_90);
  pMVar1 = (__return_storage_ptr__->
           super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pMVar2 = (__return_storage_ptr__->
           super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pMVar1 != pMVar2) {
    uVar5 = (long)pMVar2 - (long)pMVar1 >> 4;
    lVar3 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::MapKey*,std::vector<google::protobuf::MapKey,std::allocator<google::protobuf::MapKey>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::internal::MapKeySorter::MapKeyComparator>>
              (pMVar1,pMVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::MapKey*,std::vector<google::protobuf::MapKey,std::allocator<google::protobuf::MapKey>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::internal::MapKeySorter::MapKeyComparator>>
              (pMVar1,pMVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<MapKey> SortKey(const Message& message,
                                     const Reflection* reflection,
                                     const FieldDescriptor* field) {
    std::vector<MapKey> sorted_key_list;
    for (MapIterator it =
             reflection->MapBegin(const_cast<Message*>(&message), field);
         it != reflection->MapEnd(const_cast<Message*>(&message), field);
         ++it) {
      sorted_key_list.push_back(it.GetKey());
    }
    MapKeyComparator comparator;
    std::sort(sorted_key_list.begin(), sorted_key_list.end(), comparator);
    return sorted_key_list;
  }